

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O0

void Col_RopeIterBackward(ColRopeIterator *it,size_t nb)

{
  Col_Char1 *pCVar1;
  Col_Char2 *pCVar2;
  size_t local_18;
  size_t nb_local;
  ColRopeIterator *it_local;
  
  if (nb != 0) {
    if (it->index < it->length) {
      if (it->index < nb) {
        (it->chunk).first = 0xffffffffffffffff;
        if (it->rope == 0) {
          (it->chunk).last = it->index;
        }
        it->index = it->length;
      }
      else {
        it->index = it->index - nb;
        if (((it->chunk).first <= it->index) && (it->index <= (it->chunk).last)) {
          if ((it->chunk).accessProc == (undefined1 *)0x0) {
            switch((it->chunk).current.direct.format) {
            case COL_UCS1:
            case COL_UCS2:
            case COL_UCS4:
              (it->chunk).current.direct.address =
                   (void *)((long)(it->chunk).current.direct.address -
                           nb * ((it->chunk).current.direct.format & (COL_UCS4|COL_UCS2|COL_UCS1)));
              break;
            case COL_UTF8:
              local_18 = nb;
              while (local_18 != 0) {
                pCVar1 = Col_Utf8Prev((Col_Char1 *)(it->chunk).current.direct.address);
                (it->chunk).current.direct.address = pCVar1;
                local_18 = local_18 - 1;
              }
              break;
            case COL_UTF16:
              local_18 = nb;
              while (local_18 != 0) {
                pCVar2 = Col_Utf16Prev((Col_Char2 *)(it->chunk).current.direct.address);
                (it->chunk).current.direct.address = pCVar2;
                local_18 = local_18 - 1;
              }
            }
          }
          else {
            (it->chunk).current.direct.address =
                 (void *)((long)(it->chunk).current.direct.address - nb);
          }
        }
      }
    }
    else if (nb <= it->length) {
      if (it->rope == 0) {
        it->index = (it->chunk).last;
        (it->chunk).first = 0;
        (it->chunk).last = it->length - 1;
        Col_RopeIterMoveTo(it,it->length - nb);
      }
      else {
        it->index = it->length - nb;
      }
    }
  }
  return;
}

Assistant:

void
Col_RopeIterBackward(
    Col_RopeIterator it,    /*!< The iterator to move. */
    size_t nb)              /*!< Offset to move backward. */
{
    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_ROPEITER,it} */
    TYPECHECK_ROPEITER(it) return;

    if (nb == 0) {
        /*
         * No-op.
         */

        return;
    }

    if (Col_RopeIterEnd(it)) {
        /*
         * Allow iterators at end to go back.
         */

        if (nb > it->length) {
            /*
             * No-op.
             */

            return;
        }

        if (it->rope == WORD_NIL) {
            /* 
             * String iterator mode, restore previous position and move to the
             * new one (see Col_RopeIterForward and below).
             */
            it->index = it->chunk.last;
            it->chunk.first = 0;
            it->chunk.last = it->length-1;
            Col_RopeIterMoveTo(it, it->length-nb);
            return;
        }

        it->index = it->length-nb;
        return;
    } else if (it->index < nb) {
        /*
         * Beginning of rope, set iterator at end.
         */

        it->chunk.first = SIZE_MAX; /* Invalidate traversal info. */
        if (it->rope == WORD_NIL) {
            /* 
             * String iterator mode, save current index for backward iteration
             * from end (see above).
             */
            it->chunk.last = it->index;
        }
        it->index = it->length;
        return;
    }

    it->index -= nb;
    if (it->index >= it->chunk.first && it->index <= it->chunk.last) {
        /*
         * Update current chunk pointer.
         */

        if (it->chunk.accessProc) it->chunk.current.access.index -= nb;
        else {
            ASSERT(it->chunk.current.direct.address);
            switch (it->chunk.current.direct.format) {
            case COL_UCS1:
            case COL_UCS2:
            case COL_UCS4:
                it->chunk.current.direct.address
                        = (const char *) it->chunk.current.direct.address
                        - nb * CHAR_WIDTH(it->chunk.current.direct.format);
                break;

            case COL_UTF8:
                while (nb--)
                    it->chunk.current.direct.address
                            = (const char *) Col_Utf8Prev(
                            (const Col_Char1 *) it->chunk.current.direct.address);
                break;

            case COL_UTF16:
                while (nb--)
                    it->chunk.current.direct.address
                            = (const char *) Col_Utf16Prev(
                            (const Col_Char2 *) it->chunk.current.direct.address);
                break;
            }
        }
    }
}